

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

size_t mime_subparts_read(char *buffer,size_t size,size_t nitems,void *instream,_Bool *hasread)

{
  curl_mimepart *part_00;
  curl_mimepart *local_70;
  curl_mimepart *part;
  size_t sz;
  size_t cursize;
  curl_mime *mime;
  _Bool *hasread_local;
  void *instream_local;
  size_t nitems_local;
  size_t size_local;
  char *buffer_local;
  
  sz = 0;
  instream_local = (void *)nitems;
  size_local = (size_t)buffer;
  do {
    if (instream_local == (void *)0x0) {
      return sz;
    }
    part = (curl_mimepart *)0x0;
    part_00 = *(curl_mimepart **)((long)instream + 0x50);
    switch(*(undefined4 *)((long)instream + 0x48)) {
    case 0:
    case 4:
      mimesetstate((mime_state *)((long)instream + 0x48),MIMESTATE_BOUNDARY1,
                   *(void **)((long)instream + 8));
      *(long *)((long)instream + 0x58) = *(long *)((long)instream + 0x58) + 2;
      break;
    default:
      break;
    case 5:
      part = (curl_mimepart *)
             readback_bytes((mime_state *)((long)instream + 0x48),(char *)size_local,
                            (size_t)instream_local,"\r\n--",4,"",0);
      if (part == (curl_mimepart *)0x0) {
        mimesetstate((mime_state *)((long)instream + 0x48),MIMESTATE_BOUNDARY2,part_00);
      }
      break;
    case 6:
      if (part_00 == (curl_mimepart *)0x0) {
        part = (curl_mimepart *)
               readback_bytes((mime_state *)((long)instream + 0x48),(char *)size_local,
                              (size_t)instream_local,(char *)((long)instream + 0x18),0x2e,"--\r\n",4
                             );
      }
      else {
        part = (curl_mimepart *)
               readback_bytes((mime_state *)((long)instream + 0x48),(char *)size_local,
                              (size_t)instream_local,(char *)((long)instream + 0x18),0x2e,"\r\n",2);
      }
      if (part == (curl_mimepart *)0x0) {
        mimesetstate((mime_state *)((long)instream + 0x48),MIMESTATE_CONTENT,part_00);
      }
      break;
    case 7:
      if (part_00 == (curl_mimepart *)0x0) {
        mimesetstate((mime_state *)((long)instream + 0x48),MIMESTATE_END,(void *)0x0);
      }
      else {
        local_70 = (curl_mimepart *)
                   readback_part(part_00,(char *)size_local,(size_t)instream_local,hasread);
        if ((undefined1 *)((long)&local_70->parent + 2U) < (undefined1 *)0x2) {
LAB_001626af:
          if (sz != 0) {
            local_70 = (curl_mimepart *)sz;
          }
          return (size_t)local_70;
        }
        part = local_70;
        if (local_70 == (curl_mimepart *)0x0) {
          mimesetstate((mime_state *)((long)instream + 0x48),MIMESTATE_BOUNDARY1,part_00->nextpart);
        }
        else if (local_70[-0x94f21].encstate.buf + 8 < (char *)0x2) goto LAB_001626af;
      }
      break;
    case 8:
      return sz;
    }
    sz = (long)&part->parent + sz;
    size_local = (long)&part->parent + size_local;
    instream_local = (void *)((long)instream_local - (long)part);
  } while( true );
}

Assistant:

static size_t mime_subparts_read(char *buffer, size_t size, size_t nitems,
                                 void *instream, bool *hasread)
{
  curl_mime *mime = (curl_mime *) instream;
  size_t cursize = 0;
  (void) size;   /* Always 1. */

  while(nitems) {
    size_t sz = 0;
    curl_mimepart *part = mime->state.ptr;
    switch(mime->state.state) {
    case MIMESTATE_BEGIN:
    case MIMESTATE_BODY:
      mimesetstate(&mime->state, MIMESTATE_BOUNDARY1, mime->firstpart);
      /* The first boundary always follows the header termination empty line,
         so is always preceded by a CRLF. We can then spare 2 characters
         by skipping the leading CRLF in boundary. */
      mime->state.offset += 2;
      break;
    case MIMESTATE_BOUNDARY1:
      sz = readback_bytes(&mime->state, buffer, nitems, STRCONST("\r\n--"),
                          STRCONST(""));
      if(!sz)
        mimesetstate(&mime->state, MIMESTATE_BOUNDARY2, part);
      break;
    case MIMESTATE_BOUNDARY2:
      if(part)
        sz = readback_bytes(&mime->state, buffer, nitems, mime->boundary,
                            MIME_BOUNDARY_LEN, STRCONST("\r\n"));
      else
        sz = readback_bytes(&mime->state, buffer, nitems, mime->boundary,
                            MIME_BOUNDARY_LEN, STRCONST("--\r\n"));
      if(!sz) {
        mimesetstate(&mime->state, MIMESTATE_CONTENT, part);
      }
      break;
    case MIMESTATE_CONTENT:
      if(!part) {
        mimesetstate(&mime->state, MIMESTATE_END, NULL);
        break;
      }
      sz = readback_part(part, buffer, nitems, hasread);
      switch(sz) {
      case CURL_READFUNC_ABORT:
      case CURL_READFUNC_PAUSE:
      case READ_ERROR:
      case STOP_FILLING:
        return cursize ? cursize : sz;
      case 0:
        mimesetstate(&mime->state, MIMESTATE_BOUNDARY1, part->nextpart);
        break;
      }
      break;
    case MIMESTATE_END:
      return cursize;
    default:
      break;    /* other values not used in mime state. */
    }

    /* Bump buffer and counters according to read size. */
    cursize += sz;
    buffer += sz;
    nitems -= sz;
  }

  return cursize;
}